

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall
ICM::DefFunc::Convert::StringToNumber::func(StringToNumber *this,DataList *list)

{
  DataObject<(ICM::DefaultType)8> *this_00;
  long in_RDX;
  Rational<long_long> RVar1;
  allocator local_41;
  string local_40;
  NumberType num;
  
  std::__cxx11::string::string
            ((string *)&local_40,(char *)**(undefined8 **)(**(long **)(in_RDX + 8) + 8),&local_41);
  RVar1 = Common::Number::to_rational<long_long>(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  num = RVar1._numerator;
  this_00 = (DataObject<(ICM::DefaultType)8> *)operator_new(0x10);
  Objects::DataObject<(ICM::DefaultType)8>::DataObject(this_00,&num);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					TypeBase::NumberType num = (TypeBase::NumberType)Common::Number::to_rational<long long>(list[0]->dat<T_String>().c_str()).num();
					return ObjectPtr(new Objects::Number(num));
				}